

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fbo.cpp
# Opt level: O1

void __thiscall
vera::Fbo::allocate(Fbo *this,uint32_t _width,uint32_t _height,FboType _type,TextureFilter _filter,
                   TextureWrap _wrap,bool _autoclear)

{
  bool bVar1;
  GLenum GVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  string local_70;
  string local_50;
  
  this->m_autoclear = _autoclear;
  bVar1 = true;
  bVar6 = false;
  bVar7 = bVar6;
  switch(_type) {
  case COLOR_TEXTURE:
  case COLOR_FLOAT_TEXTURE:
    bVar7 = false;
    break;
  case COLOR_TEXTURE_DEPTH_BUFFER:
    bVar6 = true;
    bVar7 = false;
    bVar1 = true;
    break;
  case COLOR_DEPTH_TEXTURES:
    bVar1 = true;
    goto LAB_001fffed;
  case GBUFFER_TEXTURE:
    bVar6 = true;
    _wrap = CLAMP;
    bVar7 = false;
    bVar1 = true;
    _filter = NEAREST;
    break;
  case DEPTH_TEXTURE:
    bVar1 = false;
LAB_001fffed:
    bVar6 = true;
    bVar7 = true;
    break;
  default:
    goto switchD_001fffcf_default;
  }
  this->m_depth = bVar6;
switchD_001fffcf_default:
  if (this->m_allocated == false) {
    glGenFramebuffers(1,&this->m_fbo_id);
    if (this->m_depth == true) {
      glGenRenderbuffers(1,&this->m_depth_buffer);
    }
  }
  else if (((this->m_width == _width) && (this->m_height == _height)) && (this->m_type == _type)) {
    return;
  }
  this->m_type = _type;
  this->m_width = _width;
  this->m_height = _height;
  (*this->_vptr_Fbo[3])(this);
  if (bVar1) {
    if (this->m_id == 0) {
      glGenTextures(1,&this->m_id);
    }
    glBindTexture(0xde1,this->m_id);
    if ((_type == GBUFFER_TEXTURE) || (_type == COLOR_FLOAT_TEXTURE)) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"OES_texture_float","");
      bVar1 = haveExtension(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (bVar1) {
        iVar3 = 0x1406;
        uVar5 = 0x8814;
      }
      else {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,"OES_texture_half_float","");
        bVar1 = haveExtension(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        uVar5 = 0x805b;
        if (bVar1) {
          uVar5 = 0x881a;
        }
        iVar3 = (uint)bVar1 + (uint)bVar1 * 4 + 0x1401;
      }
    }
    else {
      iVar3 = 0x1401;
      uVar5 = 0x1908;
    }
    glTexImage2D(0xde1,0,uVar5,this->m_width,this->m_height,0,0x1908,iVar3,0);
    GVar2 = getWrap(_wrap);
    glTexParameteri(0xde1,0x2802,GVar2);
    GVar2 = getWrap(_wrap);
    glTexParameteri(0xde1,0x2803,GVar2);
    GVar2 = getMinificationFilter(_filter);
    glTexParameteri(0xde1,0x2801,GVar2);
    GVar2 = getMagnificationFilter(_filter);
    glTexParameteri(0xde1,0x2800,GVar2);
    glFramebufferTexture2D(0x8d40,0x8ce0,0xde1,this->m_id,0);
  }
  if (this->m_depth == true) {
    glBindRenderbuffer(0x8d41,this->m_depth_buffer);
    glRenderbufferStorage(0x8d41,0x8cac,this->m_width,this->m_height);
    glFramebufferRenderbuffer(0x8d40,0x8d00,0x8d41,this->m_depth_buffer);
    if (bVar7 != false) {
      if (this->m_depth_id == 0) {
        glGenTextures(1,&this->m_depth_id);
      }
      glBindTexture(0xde1,this->m_depth_id);
      glTexImage2D(0xde1,0,0x8cac,this->m_width,this->m_height,0,0x1902,0x1405,0);
      glTexParameteri(0xde1,0x2800,0x2601);
      glTexParameteri(0xde1,0x2801,0x2601);
      glTexParameteri(0xde1,0x2802,0x812f);
      glTexParameteri(0xde1,0x2803,0x812f);
      glFramebufferTexture2D(0x8d40,0x8d00,0xde1,this->m_depth_id,0);
    }
  }
  iVar3 = glCheckFramebufferStatus(0x8d40);
  if (iVar3 == 0x8cd5) {
    this->m_allocated = true;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"FBO: not complete ",0x12);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  (*this->_vptr_Fbo[4])(this);
  if (this->m_depth == true) {
    glBindRenderbuffer(0x8d41,0);
  }
  return;
}

Assistant:

void Fbo::allocate(const uint32_t _width, const uint32_t _height, FboType _type, TextureFilter _filter, TextureWrap _wrap, bool _autoclear) {
    bool color_texture = true;
    bool depth_texture = false;
    
    m_autoclear = _autoclear;
    
    switch(_type) {
        case COLOR_TEXTURE:
        case COLOR_FLOAT_TEXTURE:
            m_depth = false;
            color_texture = true;
            depth_texture = false;
        break;
        case GBUFFER_TEXTURE:
            _filter = NEAREST;
            _wrap = CLAMP;
        case COLOR_TEXTURE_DEPTH_BUFFER:
            m_depth = true;
            color_texture = true;
            depth_texture = false;
        break;
        case COLOR_DEPTH_TEXTURES:
            m_depth = true;
            color_texture = true;
            depth_texture = true;
        break;
        case DEPTH_TEXTURE:
            m_depth = true;
            color_texture = false;
            depth_texture = true;
        break;
    }

    if (!m_allocated) {
        // Create a frame buffer

        glGenFramebuffers(1, &m_fbo_id);

        // Create a texture to hold the depth buffer
        if (m_depth) 
            glGenRenderbuffers(1, &m_depth_buffer);
    }
    // If it's already declare skip
    else if (m_width == _width && m_height == _height && m_type == _type)
        return;

    m_type = _type;
    m_width = _width;
    m_height = _height;

    #if defined(__EMSCRIPTEN__)
    if ( getWebGLVersionNumber() == 1 ) {
        m_width = glm::ceilPowerOfTwo( glm::max(m_width, m_height) );
        m_height = m_width;
    } 
    #endif

    bind();
    
    if (color_texture) {

        // Generate a texture to hold the colour buffer
        if (m_id == 0) 
            glGenTextures(1, &m_id);

        // Color
        glBindTexture(GL_TEXTURE_2D, m_id);

        GLenum format = GL_RGBA;
        GLenum type = GL_UNSIGNED_BYTE;

#if defined(PLATFORM_RPI) || defined(DRIVER_GBM)
#else
        if (_type == COLOR_FLOAT_TEXTURE || 
            _type == GBUFFER_TEXTURE) {
            if ( haveExtension("OES_texture_float") ) {
                format = GL_RGBA32F;
                type = GL_FLOAT;
            }
            else if ( haveExtension("OES_texture_half_float") ) {
                format = GL_RGBA16F;
                type = GL_FLOAT;
            }
            else {
                format = GL_RGBA16;
                type = GL_UNSIGNED_BYTE;
            }
        }
#endif

        glTexImage2D(GL_TEXTURE_2D, 0, format, m_width, m_height, 0, GL_RGBA, type, NULL);

        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, getWrap(_wrap));
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, getWrap(_wrap));
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, getMinificationFilter(_filter));
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, getMagnificationFilter(_filter));
        glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_id, 0);
    }

    // Depth Buffer
    if (m_depth) {
        glBindRenderbuffer(GL_RENDERBUFFER, m_depth_buffer);

        GLenum depth_format = GL_DEPTH_COMPONENT;
        GLenum depth_type = GL_UNSIGNED_SHORT;

#if defined(PLATFORM_RPI) || defined(DRIVER_GBM)
        depth_format = GL_DEPTH_COMPONENT16;

    #if GL_OES_depth32
        if ( haveExtension("GL_OES_depth32") )
            depth_format = GL_DEPTH_COMPONENT32_OES;
    #elif GL_OES_depth24
        if ( haveExtension("GL_OES_depth24") )
            depth_format = GL_DEPTH_COMPONENT24_OES;
    #endif

#elif defined(__EMSCRIPTEN__)
        depth_format = (getWebGLVersionNumber() == 1)? GL_DEPTH_COMPONENT : GL_DEPTH_COMPONENT16;

#else 
        depth_format = GL_DEPTH_COMPONENT32F;
        depth_type = GL_UNSIGNED_INT;

#endif
        glRenderbufferStorage(GL_RENDERBUFFER, depth_format, m_width, m_height);
        glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, m_depth_buffer);
    
        if (depth_texture) {

            // Generate a texture to hold the depth buffer
            if (m_depth_id == 0)
                glGenTextures(1, &m_depth_id);

            glBindTexture(GL_TEXTURE_2D, m_depth_id);
            glTexImage2D(GL_TEXTURE_2D, 0, depth_format, m_width, m_height, 0, GL_DEPTH_COMPONENT, depth_type, 0);

            #if defined(__EMSCRIPTEN__)
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
            #else
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
            #endif
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

            glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_2D, m_depth_id, 0);
        }
    }

    // CHECK
    GLenum result = glCheckFramebufferStatus(GL_FRAMEBUFFER);
    if (result == GL_FRAMEBUFFER_COMPLETE) m_allocated = true;
    else std::cout << "FBO: not complete " << result << std::endl;
    
    unbind();

    if (m_depth)
        glBindRenderbuffer(GL_RENDERBUFFER, 0);
}